

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumStatement
          (Parser *this,EnumDescriptorProto *enum_type,LocationRecorder *enum_location)

{
  void **ppvVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  EnumOptions *this_00;
  EnumValueDescriptorProto *enum_value;
  int iVar5;
  LocationRecorder location;
  LocationRecorder local_30;
  
  bVar2 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  bVar3 = true;
  if (!bVar2) {
    iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar4 == 0) {
      LocationRecorder::LocationRecorder(&local_30,enum_location,3);
      *(byte *)enum_type->_has_bits_ = (byte)enum_type->_has_bits_[0] | 4;
      this_00 = enum_type->options_;
      if (this_00 == (EnumOptions *)0x0) {
        this_00 = (EnumOptions *)operator_new(0x68);
        EnumOptions::EnumOptions(this_00);
        enum_type->options_ = this_00;
      }
      bVar3 = ParseOption(this,&this_00->super_Message,&local_30,OPTION_STATEMENT);
    }
    else {
      LocationRecorder::LocationRecorder
                (&local_30,enum_location,2,
                 (enum_type->value_).super_RepeatedPtrFieldBase.current_size_);
      iVar4 = (enum_type->value_).super_RepeatedPtrFieldBase.current_size_;
      iVar5 = (enum_type->value_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar4 < iVar5) {
        ppvVar1 = (enum_type->value_).super_RepeatedPtrFieldBase.elements_;
        (enum_type->value_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        enum_value = (EnumValueDescriptorProto *)ppvVar1[iVar4];
      }
      else {
        if (iVar5 == (enum_type->value_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(enum_type->value_).super_RepeatedPtrFieldBase,iVar5 + 1);
          iVar5 = (enum_type->value_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (enum_type->value_).super_RepeatedPtrFieldBase.allocated_size_ = iVar5 + 1;
        enum_value = internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>::New()
        ;
        ppvVar1 = (enum_type->value_).super_RepeatedPtrFieldBase.elements_;
        iVar4 = (enum_type->value_).super_RepeatedPtrFieldBase.current_size_;
        (enum_type->value_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        ppvVar1[iVar4] = enum_value;
      }
      bVar3 = ParseEnumConstant(this,enum_value,&local_30);
    }
    LocationRecorder::~LocationRecorder(&local_30);
  }
  return bVar3;
}

Assistant:

bool Parser::ParseEnumStatement(EnumDescriptorProto* enum_type,
                                const LocationRecorder& enum_location) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("option")) {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kOptionsFieldNumber);
    return ParseOption(enum_type->mutable_options(), location,
                       OPTION_STATEMENT);
  } else {
    LocationRecorder location(enum_location,
        EnumDescriptorProto::kValueFieldNumber, enum_type->value_size());
    return ParseEnumConstant(enum_type->add_value(), location);
  }
}